

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_student.cpp
# Opt level: O1

void use_student(void)

{
  Student *stu;
  ostream *poVar1;
  long lVar2;
  double dVar3;
  Student list [2];
  Student local_88 [2];
  
  L14_1::Student::Student(local_88,3);
  L14_1::Student::Student(local_88 + 1,3);
  lVar2 = 0;
  do {
    set_student((Student *)((long)&local_88[0]._name._M_dataplus._M_p + lVar2),3);
    lVar2 = lVar2 + 0x30;
  } while (lVar2 == 0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nResult:\n",9);
  lVar2 = 0;
  do {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    poVar1 = (ostream *)std::ostream::flush();
    stu = (Student *)((long)&local_88[0]._name._M_dataplus._M_p + lVar2);
    L14_1::operator<<(poVar1,stu);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"average: ",9);
    dVar3 = L14_1::Student::get_average(stu);
    poVar1 = std::ostream::_M_insert<double>(dVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    lVar2 = lVar2 + 0x30;
  } while (lVar2 == 0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done!\n",6);
  lVar2 = 0x30;
  do {
    L14_1::Student::~Student((Student *)((long)&local_88[0]._name._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != -0x30);
  return;
}

Assistant:

void use_student() {
    using namespace L14_1;

    const int num_student = 2;
    const int num_quiz = 3;

    Student list[num_student] = {
            Student(num_quiz),
            Student(num_quiz),
    };
    int i = 0;
    for (i = 0; i < num_student; i++) {
        set_student(list[i], num_quiz);
    }

    std::cout << "\nResult:\n";
    for (i = 0; i < num_student; i++) {
        std::cout << std::endl << list[i];
        std::cout << "average: " << list[i].get_average() << std::endl;
    }
    std::cout << "Done!\n";
}